

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base32.hpp
# Opt level: O3

string * __thiscall
pstore::base32::convert<pstore::uint128>(string *__return_storage_ptr__,base32 *this,uint128 val)

{
  ulong in_RDX;
  uint64_t high;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  do {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    this = (base32 *)((ulong)this >> 5 | in_RDX << 0x3b);
    in_RDX = in_RDX >> 5;
  } while (this != (base32 *)0x0 || in_RDX != 0);
  return __return_storage_ptr__;
}

Assistant:

std::string convert (IntType val) {
            std::string result;
            auto const max_length = 26;
            PSTORE_ASSERT (std::pow (32.0, max_length) >= std::pow (2.0, 128));
            result.reserve (max_length);
            convert (val, std::back_inserter (result));
            return result;
        }